

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arguments.cpp
# Opt level: O1

void __thiscall xmrig::Arguments::Arguments(Arguments *this,int argc,char **argv)

{
  long lVar1;
  
  this->m_argv = argv;
  this->m_argc = argc;
  (this->m_data).super__Vector_base<xmrig::String,_std::allocator<xmrig::String>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_data).super__Vector_base<xmrig::String,_std::allocator<xmrig::String>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_data).super__Vector_base<xmrig::String,_std::allocator<xmrig::String>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uv_setup_args(argc,argv);
  if (argc != 0) {
    lVar1 = 0;
    do {
      add(this,argv[lVar1]);
      lVar1 = lVar1 + 1;
    } while (argc != lVar1);
  }
  return;
}

Assistant:

xmrig::Arguments::Arguments(int argc, char **argv) :
    m_argv(argv),
    m_argc(argc)
{
    uv_setup_args(argc, argv);

    for (size_t i = 0; i < static_cast<size_t>(argc); ++i) {
        add(argv[i]);
    }
}